

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporary_file_manager.cpp
# Opt level: O1

void __thiscall
duckdb::TemporaryFileManager::WriteTemporaryBuffer
          (TemporaryFileManager *this,block_id_t block_id,FileBuffer *buffer)

{
  _Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false> this_00;
  TemporaryBufferSize size_p;
  FileBuffer *buffer_00;
  idx_t iVar1;
  int64_t time_before_ns;
  mapped_type *pmVar2;
  pointer this_01;
  mapped_type *this_02;
  TemporaryFileHandle *this_03;
  mapped_type *pmVar3;
  __node_base *p_Var4;
  TemporaryFileCompressionAdaptivity *compression_adaptivity;
  CompressionResult CVar5;
  optional_ptr<duckdb::TemporaryFileHandle,_true> handle;
  TemporaryFileIndex index;
  idx_t index_1;
  TemporaryFileManagerLock lock;
  CompressionResult compression_result;
  AllocatedData compressed_buffer;
  TemporaryFileIdentifier identifier;
  _Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false> local_c0;
  TemporaryFileIndex local_b8;
  TemporaryFileIndex local_a0;
  lock_guard<std::mutex> local_88;
  TemporaryBufferSize local_80;
  TemporaryCompressionLevel local_78;
  TemporaryFileMap *local_70;
  FileBuffer *local_68;
  block_id_t local_60;
  AllocatedData local_58;
  TemporaryFileIdentifier local_40;
  
  local_60 = block_id;
  iVar1 = TaskScheduler::GetEstimatedCPUId();
  compression_adaptivity = (this->compression_adaptivities)._M_elems + ((uint)iVar1 & 0x3f);
  time_before_ns = ::std::chrono::_V2::system_clock::now();
  AllocatedData::AllocatedData(&local_58);
  CVar5 = CompressBuffer(this,compression_adaptivity,buffer,&local_58);
  local_80 = CVar5.size;
  local_78 = CVar5.level;
  TemporaryFileIndex::TemporaryFileIndex(&local_b8);
  local_c0._M_head_impl = (TemporaryFileHandle *)0x0;
  TemporaryFileManagerLock::TemporaryFileManagerLock
            ((TemporaryFileManagerLock *)&local_88,&this->manager_lock);
  local_a0.identifier.size = local_80;
  local_68 = buffer;
  pmVar2 = ::std::__detail::
           _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_std::unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&(this->files).files,(key_type *)&local_a0);
  local_70 = &this->files;
  p_Var4 = &(pmVar2->_M_h)._M_before_begin;
  do {
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) goto LAB_017f0a32;
    this_01 = unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
              ::operator->((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>,_true>
                            *)(p_Var4 + 2));
    TemporaryFileHandle::TryGetBlockIndex(&local_a0,this_01);
    local_b8.block_index.index = local_a0.block_index.index;
    local_b8.identifier.size = local_a0.identifier.size;
    local_b8.identifier.file_index.index = local_a0.identifier.file_index.index;
  } while (((local_a0.identifier.size == INVALID) ||
           (local_a0.identifier.file_index.index == 0xffffffffffffffff)) ||
          (local_a0.block_index.index == 0xffffffffffffffff));
  local_c0._M_head_impl =
       (((unique_ptr<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
          *)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor)->_M_t).
       super___uniq_ptr_impl<duckdb::TemporaryFileHandle,_std::default_delete<duckdb::TemporaryFileHandle>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::TemporaryFileHandle_*,_std::default_delete<duckdb::TemporaryFileHandle>_>
       .super__Head_base<0UL,_duckdb::TemporaryFileHandle_*,_false>._M_head_impl;
LAB_017f0a32:
  size_p = local_80;
  if (local_c0._M_head_impl == (TemporaryFileHandle *)0x0) {
    this_02 = ::std::__detail::
              _Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<duckdb::TemporaryBufferSize,_std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>,_std::allocator<std::pair<const_duckdb::TemporaryBufferSize,_duckdb::BlockIndexManager>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::TemporaryBufferSize>,_duckdb::EnumClassHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->index_managers,&local_80);
    local_a0.identifier.size = BlockIndexManager::GetNewBlockIndexInternal(this_02,local_80);
    ::std::
    _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
    ::_M_insert_unique<unsigned_long_const&>
              ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                *)&this_02->indexes_in_use,(unsigned_long *)&local_a0);
    TemporaryFileIdentifier::TemporaryFileIdentifier(&local_40,size_p,local_a0.identifier.size);
    this_03 = TemporaryFileMap::CreateFile(local_70,&local_40);
    TemporaryFileHandle::TryGetBlockIndex(&local_a0,this_03);
    local_b8.block_index.index = local_a0.block_index.index;
    local_b8.identifier.size = local_a0.identifier.size;
    local_b8.identifier.file_index.index = local_a0.identifier.file_index.index;
    local_c0._M_head_impl = this_03;
  }
  pmVar3 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::TemporaryFileIndex>,_std::allocator<std::pair<const_long,_duckdb::TemporaryFileIndex>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->used_blocks,&local_60);
  (pmVar3->block_index).index = local_b8.block_index.index;
  (pmVar3->identifier).size = local_b8.identifier.size;
  (pmVar3->identifier).file_index.index = local_b8.identifier.file_index.index;
  pthread_mutex_unlock((pthread_mutex_t *)local_88._M_device);
  optional_ptr<duckdb::TemporaryFileHandle,_true>::CheckValid
            ((optional_ptr<duckdb::TemporaryFileHandle,_true> *)&local_c0);
  buffer_00 = local_68;
  this_00._M_head_impl = local_c0._M_head_impl;
  iVar1 = optional_idx::GetIndex(&local_b8.block_index);
  TemporaryFileHandle::WriteTemporaryBuffer(this_00._M_head_impl,buffer_00,iVar1,&local_58);
  TemporaryFileCompressionAdaptivity::Update(compression_adaptivity,local_78,time_before_ns);
  AllocatedData::~AllocatedData(&local_58);
  return;
}

Assistant:

void TemporaryFileManager::WriteTemporaryBuffer(block_id_t block_id, FileBuffer &buffer) {
	// We group DEFAULT_BLOCK_ALLOC_SIZE blocks into the same file.
	D_ASSERT(buffer.AllocSize() == BufferManager::GetBufferManager(db).GetBlockAllocSize());

	const auto adaptivity_idx = TaskScheduler::GetEstimatedCPUId() % COMPRESSION_ADAPTIVITIES;
	auto &compression_adaptivity = compression_adaptivities[adaptivity_idx];

	const auto time_before_ns = TemporaryFileCompressionAdaptivity::GetCurrentTimeNanos();
	AllocatedData compressed_buffer;
	const auto compression_result = CompressBuffer(compression_adaptivity, buffer, compressed_buffer);

	TemporaryFileIndex index;
	optional_ptr<TemporaryFileHandle> handle;
	{
		TemporaryFileManagerLock lock(manager_lock);
		// first check if we can write to an open existing file
		for (auto &entry : files.GetMapForSize(compression_result.size)) {
			auto &temp_file = entry.second;
			index = temp_file->TryGetBlockIndex();
			if (index.IsValid()) {
				handle = entry.second.get();
				break;
			}
		}
		if (!handle) {
			// no existing handle to write to; we need to create & open a new file
			auto &size = compression_result.size;
			const TemporaryFileIdentifier identifier(size, index_managers[size].GetNewBlockIndex(size));
			auto &new_file = files.CreateFile(identifier);
			index = new_file.TryGetBlockIndex();
			handle = &new_file;
		}
		D_ASSERT(used_blocks.find(block_id) == used_blocks.end());
		used_blocks[block_id] = index;
	}
	D_ASSERT(handle);
	D_ASSERT(index.IsValid());

	handle->WriteTemporaryBuffer(buffer, index.block_index.GetIndex(), compressed_buffer);

	compression_adaptivity.Update(compression_result.level, time_before_ns);
}